

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_file_stream.cpp
# Opt level: O0

void word_count(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  char *filename;
  int idx;
  char ch;
  long total;
  long count;
  ifstream fin;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    std::operator<<(poVar4," filenames[s]\n");
    exit(1);
  }
  std::operator<<((ostream *)&std::cout,"ok, processing...\n");
  std::ifstream::ifstream(&count);
  _idx = 0;
  for (filename._0_4_ = 1; (int)filename < argc; filename._0_4_ = (int)filename + 1) {
    pcVar1 = argv[(int)filename];
    std::ifstream::open((char *)&count,(_Ios_Openmode)pcVar1);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
      poVar4 = std::operator<<(poVar4,pcVar1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ios::clear((long)&count + *(long *)(count + -0x18),0);
    }
    else {
      total = 0;
      while( true ) {
        plVar5 = (long *)std::istream::get((char *)&count);
        bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
        if (!bVar3) break;
        total = total + 1;
      }
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,total);
      poVar4 = std::operator<<(poVar4," characters in ");
      poVar4 = std::operator<<(poVar4,pcVar1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      _idx = _idx + total;
      std::ios::clear((long)&count + *(long *)(count + -0x18),0);
      std::ifstream::close();
    }
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,_idx);
  std::operator<<(poVar4," characters in all files\n");
  std::ifstream::~ifstream(&count);
  return;
}

Assistant:

void word_count(int argc, char * argv[]) {
    using namespace std;

//    argc = 2;
//    char *f1 = "justify";
//    char *f2 = "number.txt";
//    char *f3 = "tobuy.txt";
//    argv = {
//            &f1,
//    };

    //  no arguments
    if (argc == 1) {
        cerr << "Usage: " << argv[0] << " filenames[s]\n";
        exit(EXIT_FAILURE);
    }
    cout << "ok, processing...\n";
//    getchar();

    ifstream fin;
    long count;
    long total = 0;
    char ch;

    //  iterate through args as filename
    for(int idx = 1; idx < argc; idx++) {
//        auto filename = argv[idx];
        char *filename = argv[idx];

        fin.open(filename);
        if (!fin.is_open()) {
            cerr << "Cannot open " << filename << endl;
            fin.clear();
            continue;
        }
        count = 0;
        //  read file
        while(fin.get(ch)) {
            count++;
        }
        cout << count << " characters in " << filename << endl;
        total += count;
        fin.clear();
        fin.close();
    }

    cout << total << " characters in all files\n";
}